

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O2

int connection_endpoint_get_incoming_channel(ENDPOINT_HANDLE endpoint,uint16_t *incoming_channel)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (endpoint == (ENDPOINT_HANDLE)0x0 || incoming_channel == (uint16_t *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x7b5;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"connection_endpoint_get_incoming_channel",0x7b4,1,
                "Bad arguments: endpoint = %p, incoming_channel = %p",endpoint,incoming_channel);
    }
  }
  else {
    *incoming_channel = endpoint->incoming_channel;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int connection_endpoint_get_incoming_channel(ENDPOINT_HANDLE endpoint, uint16_t* incoming_channel)
{
    int result;

    if ((endpoint == NULL) ||
        (incoming_channel == NULL))
    {
        LogError("Bad arguments: endpoint = %p, incoming_channel = %p",
            endpoint, incoming_channel);
        result = MU_FAILURE;
    }
    else
    {
        *incoming_channel = endpoint->incoming_channel;
        result = 0;
    }

    return result;
}